

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O3

lzma_index * lzma_index_init(lzma_allocator *allocator)

{
  lzma_index *tree;
  index_tree_node *node;
  
  tree = (lzma_index *)lzma_alloc(0x50,allocator);
  if (tree != (lzma_index *)0x0) {
    *(undefined8 *)((long)&(tree->streams).leftmost + 4) = 0;
    *(undefined8 *)((long)&(tree->streams).rightmost + 4) = 0;
    (tree->streams).root = (index_tree_node *)0x0;
    (tree->streams).leftmost = (index_tree_node *)0x0;
    tree->uncompressed_size = 0;
    tree->total_size = 0;
    tree->record_count = 0;
    tree->index_list_size = 0;
    tree->prealloc = 0x200;
    tree->checks = 0;
    node = (index_tree_node *)lzma_alloc(0xa8,allocator);
    if (node != (index_tree_node *)0x0) {
      node->parent = (index_tree_node *)0x0;
      node->left = (index_tree_node *)0x0;
      node->uncompressed_base = 0;
      node->compressed_base = 0;
      node->right = (index_tree_node *)0x0;
      *(undefined4 *)&node[1].uncompressed_base = 1;
      node[2].compressed_base = 0;
      node[2].parent = (index_tree_node *)0x0;
      node[1].compressed_base = 0;
      node[1].parent = (index_tree_node *)0x0;
      node[1].left = (index_tree_node *)0x0;
      node[1].right = (index_tree_node *)0x0;
      *(undefined4 *)&node[2].uncompressed_base = 0;
      *(undefined4 *)&node[2].left = 0xffffffff;
      node[4].uncompressed_base = 0;
      index_tree_append((index_tree *)tree,node);
      return tree;
    }
    lzma_free(tree,allocator);
  }
  return (lzma_index *)0x0;
}

Assistant:

extern LZMA_API(lzma_index *)
lzma_index_init(lzma_allocator *allocator)
{
	index_stream *s;

	lzma_index *i = index_init_plain(allocator);
	if (i == NULL)
		return NULL;

	s = index_stream_init(0, 0, 1, 0, allocator);
	if (s == NULL) {
		lzma_free(i, allocator);
		return NULL;
	}

	index_tree_append(&i->streams, &s->node);

	return i;
}